

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O3

bool draco::ReadFileToBuffer(string *file_name,vector<char,_std::allocator<char>_> *buffer)

{
  undefined1 uVar1;
  long *in_RAX;
  pointer *__ptr;
  _Alloc_hider local_18;
  
  local_18._M_p = (pointer)in_RAX;
  FileReaderFactory::OpenReader((string *)&stack0xffffffffffffffe8);
  if ((long *)local_18._M_p == (long *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = (**(code **)(*(long *)local_18._M_p + 0x10))(local_18._M_p,buffer);
    if ((long *)local_18._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_18._M_p + 8))();
    }
  }
  return (bool)uVar1;
}

Assistant:

bool ReadFileToBuffer(const std::string &file_name, std::vector<char> *buffer) {
  std::unique_ptr<FileReaderInterface> file_reader =
      FileReaderFactory::OpenReader(file_name);
  if (file_reader == nullptr) {
    return false;
  }
  return file_reader->ReadFileToBuffer(buffer);
}